

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

VariablesWithType * __thiscall
soul::heart::Utilities::VariableListByType::getType(VariableListByType *this,Type *typeNeeded)

{
  bool bVar1;
  reference pvVar2;
  value_type local_70;
  reference local_40;
  VariablesWithType *type;
  iterator __end2;
  iterator __begin2;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  *__range2;
  Type *typeNeeded_local;
  VariableListByType *this_local;
  
  __end2 = std::
           vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
           ::begin(&this->types);
  type = (VariablesWithType *)
         std::
         vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
         ::end(&this->types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
                                *)&type);
    if (!bVar1) {
      Type::Type(&local_70.type,typeNeeded);
      local_70.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ::vector(&local_70.variables);
      std::
      vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ::push_back(&this->types,&local_70);
      VariablesWithType::~VariablesWithType(&local_70);
      pvVar2 = std::
               vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
               ::back(&this->types);
      return pvVar2;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
               ::operator*(&__end2);
    bVar1 = Type::isIdentical(&local_40->type,typeNeeded);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
    ::operator++(&__end2);
  }
  return local_40;
}

Assistant:

VariablesWithType& getType (Type typeNeeded)
        {
            for (auto& type : types)
                if (type.type.isIdentical (typeNeeded))
                    return type;

            types.push_back ({ std::move (typeNeeded), {} });
            return types.back();
        }